

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBac.c
# Opt level: O0

void Bac_ManWriteBacNtk(Vec_Str_t *vOut,Bac_Ntk_t *pNtk)

{
  int iVar1;
  char *pBuffer;
  int *piVar2;
  Bac_Ntk_t *pNtk_local;
  Vec_Str_t *vOut_local;
  
  pBuffer = Vec_StrArray(&pNtk->vType);
  iVar1 = Bac_NtkObjNum(pNtk);
  Vec_StrPushBuffer(vOut,pBuffer,iVar1);
  piVar2 = Vec_IntArray(&pNtk->vFanin);
  iVar1 = Bac_NtkObjNum(pNtk);
  Vec_StrPushBuffer(vOut,(char *)piVar2,iVar1 << 2);
  piVar2 = Vec_IntArray(&pNtk->vInfo);
  iVar1 = Bac_NtkInfoNum(pNtk);
  Vec_StrPushBuffer(vOut,(char *)piVar2,iVar1 * 0xc);
  return;
}

Assistant:

void Bac_ManWriteBacNtk( Vec_Str_t * vOut, Bac_Ntk_t * pNtk )
{
    //char * pName; int iObj, NameId;
    Vec_StrPushBuffer( vOut, (char *)Vec_StrArray(&pNtk->vType),       Bac_NtkObjNum(pNtk) );
    Vec_StrPushBuffer( vOut, (char *)Vec_IntArray(&pNtk->vFanin),  4 * Bac_NtkObjNum(pNtk) );
    Vec_StrPushBuffer( vOut, (char *)Vec_IntArray(&pNtk->vInfo),  12 * Bac_NtkInfoNum(pNtk) );
/*
    // write input/output/box names
    Bac_NtkForEachPiMain( pNtk, iObj, i )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
    Bac_NtkForEachPoMain( pNtk, iObj, i )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
    Bac_NtkForEachBox( pNtk, iObj )
    {
        pName = Bac_ObjNameStr( pNtk, iObj );  
        Vec_StrPrintStr( vOut, pName );
        Vec_StrPush( vOut, '\0' );
    }
*/
}